

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCxxModuleMapper.cxx
# Opt level: O0

string * CxxModuleMapContent_abi_cxx11_
                   (string *__return_storage_ptr__,CxxModuleMapFormat format,CxxModuleLocations *loc
                   ,cmScanDepInfo *obj,CxxModuleUsage *usages)

{
  CxxModuleUsage *usages_local;
  cmScanDepInfo *obj_local;
  CxxModuleLocations *loc_local;
  CxxModuleMapFormat format_local;
  
  if (format == Gcc) {
    (anonymous_namespace)::CxxModuleMapContentGcc_abi_cxx11_
              (__return_storage_ptr__,(_anonymous_namespace_ *)loc,(CxxModuleLocations *)obj,obj);
  }
  else {
    if (format != Msvc) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCxxModuleMapper.cxx"
                    ,0x132,
                    "std::string CxxModuleMapContent(CxxModuleMapFormat, const CxxModuleLocations &, const cmScanDepInfo &, const CxxModuleUsage &)"
                   );
    }
    (anonymous_namespace)::CxxModuleMapContentMsvc_abi_cxx11_
              (__return_storage_ptr__,(_anonymous_namespace_ *)loc,(CxxModuleLocations *)obj,
               (cmScanDepInfo *)usages,usages);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CxxModuleMapContent(CxxModuleMapFormat format,
                                CxxModuleLocations const& loc,
                                cmScanDepInfo const& obj,
                                CxxModuleUsage const& usages)
{
  switch (format) {
    case CxxModuleMapFormat::Gcc:
      return CxxModuleMapContentGcc(loc, obj);
    case CxxModuleMapFormat::Msvc:
      return CxxModuleMapContentMsvc(loc, obj, usages);
  }

  assert(false);
  return {};
}